

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O0

TestStatus *
vkt::wsi::anon_unknown_0::createSurfaceTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  undefined1 *this;
  VkInstance instance;
  RefData<vk::Handle<(vk::HandleType)25>_> data;
  Type TVar1;
  VkInstance_s **ppVVar2;
  Display *nativeDisplay;
  Window *nativeWindow;
  allocator<char> local_299;
  string local_298;
  Move<vk::Handle<(vk::HandleType)25>_> local_278;
  RefData<vk::Handle<(vk::HandleType)25>_> local_258;
  undefined1 local_238 [8];
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  Maybe<tcu::Vector<unsigned_int,_2>_> local_208;
  undefined1 local_1f8 [8];
  NativeObjects native;
  InstanceHelper instHelper;
  Type wsiType_local;
  Context *context_local;
  
  this = &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
          m_data.field_0x8;
  instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX._4_4_ = wsiType;
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)this,context,wsiType,(VkAllocationCallbacks *)0x0);
  TVar1 = instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX._4_4_;
  tcu::nothing<tcu::Vector<unsigned_int,2>>();
  NativeObjects::NativeObjects
            ((NativeObjects *)local_1f8,context,(Extensions *)this,TVar1,&local_208);
  tcu::Maybe<tcu::Vector<unsigned_int,_2>_>::~Maybe(&local_208);
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  TVar1 = instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX._4_4_;
  instance = *ppVVar2;
  nativeDisplay =
       de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::operator*
                 ((UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)local_1f8);
  nativeWindow = de::details::UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::
                 operator*((UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)
                           &native.display.
                            super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>
                            .m_data.field_0x8);
  ::vk::wsi::createSurface
            (&local_278,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             instance,TVar1,nativeDisplay,nativeWindow,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_258,(Move *)&local_278);
  data.deleter.m_instanceIface = local_258.deleter.m_instanceIface;
  data.object.m_internal = local_258.object.m_internal;
  data.deleter.m_instance = local_258.deleter.m_instance;
  data.deleter.m_allocator = local_258.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_238,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)25>_>::~Move(&local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"Creating surface succeeded",&local_299);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_238);
  NativeObjects::~NativeObjects((NativeObjects *)local_1f8);
  InstanceHelper::~InstanceHelper
            ((InstanceHelper *)
             &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
              m_data.field_0x8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSurfaceTest (Context& context, Type wsiType)
{
	const InstanceHelper		instHelper	(context, wsiType);
	const NativeObjects			native		(context, instHelper.supportedExtensions, wsiType);
	const Unique<VkSurfaceKHR>	surface		(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));

	return tcu::TestStatus::pass("Creating surface succeeded");
}